

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntTwoMerge2Int(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vArr)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *pEnd2;
  int *pEnd1;
  int *pBeg2;
  int *pBeg1;
  int *pBeg;
  Vec_Int_t *vArr_local;
  Vec_Int_t *vArr2_local;
  Vec_Int_t *vArr1_local;
  
  pBeg1 = vArr->pArray;
  pBeg2 = vArr1->pArray;
  pEnd1 = vArr2->pArray;
  piVar3 = vArr1->pArray;
  iVar1 = vArr1->nSize;
  piVar4 = vArr2->pArray;
  iVar2 = vArr2->nSize;
  while (pBeg2 < piVar3 + iVar1 && pEnd1 < piVar4 + iVar2) {
    if (*pBeg2 == *pEnd1) {
      *pBeg1 = *pBeg2;
      pEnd1 = pEnd1 + 1;
      pBeg2 = pBeg2 + 1;
    }
    else if (*pBeg2 < *pEnd1) {
      *pBeg1 = *pBeg2;
      pBeg2 = pBeg2 + 1;
    }
    else {
      *pBeg1 = *pEnd1;
      pEnd1 = pEnd1 + 1;
    }
    pBeg1 = pBeg1 + 1;
  }
  while (pBeg2 < piVar3 + iVar1) {
    *pBeg1 = *pBeg2;
    pBeg2 = pBeg2 + 1;
    pBeg1 = pBeg1 + 1;
  }
  while (pEnd1 < piVar4 + iVar2) {
    *pBeg1 = *pEnd1;
    pEnd1 = pEnd1 + 1;
    pBeg1 = pBeg1 + 1;
  }
  vArr->nSize = (int)((long)pBeg1 - (long)vArr->pArray >> 2);
  if (vArr->nCap < vArr->nSize) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x6ec,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (vArr->nSize < vArr1->nSize) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x6ed,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (vArr2->nSize <= vArr->nSize) {
    return;
  }
  __assert_fail("vArr->nSize >= vArr2->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x6ee,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

static inline void Vec_IntTwoMerge2Int( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vArr )
{
    int * pBeg  = vArr->pArray;
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    vArr->nSize = pBeg - vArr->pArray;
    assert( vArr->nSize <= vArr->nCap );
    assert( vArr->nSize >= vArr1->nSize );
    assert( vArr->nSize >= vArr2->nSize );
}